

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_image_test.cc
# Opt level: O1

void __thiscall
AomImageTest_AomImgSetRectOverflow_Test::TestBody(AomImageTest_AomImgSetRectOverflow_Test *this)

{
  undefined8 *puVar1;
  int iVar2;
  SEARCH_METHODS *pSVar3;
  AssertionResult gtest_ar;
  aom_image_t img;
  uchar buf [49152];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c0d0;
  AssertHelper local_c0c8;
  internal local_c0c0 [8];
  undefined8 *local_c0b8;
  aom_image_t local_c0b0;
  uchar local_c008 [49152];
  
  local_c0d0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       aom_img_wrap(&local_c0b0,AOM_IMG_FMT_I444,0x80,0x80,0x20,local_c008);
  local_c0c8.data_ = (AssertHelperData *)&local_c0b0;
  testing::internal::CmpHelperEQ<aom_image*,aom_image*>
            (local_c0c0,"aom_img_wrap(&img, format, kWidth, kHeight, align, buf)","&img",
             (aom_image **)&local_c0d0,(aom_image **)&local_c0c8);
  if (local_c0c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c0d0);
    if (local_c0b8 == (undefined8 *)0x0) {
      pSVar3 = "";
    }
    else {
      pSVar3 = (SEARCH_METHODS *)*local_c0b8;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/aom_image_test.cc"
               ,0x2b,(char *)pSVar3);
    testing::internal::AssertHelper::operator=(&local_c0c8,(Message *)&local_c0d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c0c8);
    if ((aom_image_t *)local_c0d0._M_head_impl != (aom_image_t *)0x0) {
      (**(code **)(*(long *)local_c0d0._M_head_impl + 8))();
    }
  }
  puVar1 = local_c0b8;
  if (local_c0b8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_c0b8 != local_c0b8 + 2) {
      operator_delete((undefined8 *)*local_c0b8);
    }
    operator_delete(puVar1);
  }
  iVar2 = aom_img_set_rect(&local_c0b0,0,0,0x80,0x80,0);
  local_c0d0._M_head_impl._0_4_ = iVar2;
  local_c0c8.data_ = local_c0c8.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,int>
            (local_c0c0,"aom_img_set_rect(&img, 0, 0, kWidth, kHeight, 0)","0",(int *)&local_c0d0,
             (int *)&local_c0c8);
  if (local_c0c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c0d0);
    if (local_c0b8 == (undefined8 *)0x0) {
      pSVar3 = "";
    }
    else {
      pSVar3 = (SEARCH_METHODS *)*local_c0b8;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/aom_image_test.cc"
               ,0x2d,(char *)pSVar3);
    testing::internal::AssertHelper::operator=(&local_c0c8,(Message *)&local_c0d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c0c8);
    if (local_c0d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c0d0._M_head_impl + 8))();
    }
  }
  puVar1 = local_c0b8;
  if (local_c0b8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_c0b8 != local_c0b8 + 2) {
      operator_delete((undefined8 *)*local_c0b8);
    }
    operator_delete(puVar1);
  }
  iVar2 = aom_img_set_rect(&local_c0b0,0xffffffff,0xffffffff,0x80,0x80,0);
  local_c0d0._M_head_impl._0_4_ = iVar2;
  local_c0c8.data_ = local_c0c8.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperNE<int,int>
            (local_c0c0,
             "aom_img_set_rect(&img, static_cast<unsigned int>(-1), static_cast<unsigned int>(-1), kWidth, kHeight, 0)"
             ,"0",(int *)&local_c0d0,(int *)&local_c0c8);
  if (local_c0c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c0d0);
    if (local_c0b8 == (undefined8 *)0x0) {
      pSVar3 = "";
    }
    else {
      pSVar3 = (SEARCH_METHODS *)*local_c0b8;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/aom_image_test.cc"
               ,0x31,(char *)pSVar3);
    testing::internal::AssertHelper::operator=(&local_c0c8,(Message *)&local_c0d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c0c8);
    if (local_c0d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c0d0._M_head_impl + 8))();
    }
  }
  if (local_c0b8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_c0b8 != local_c0b8 + 2) {
      operator_delete((undefined8 *)*local_c0b8);
    }
    operator_delete(local_c0b8);
  }
  return;
}

Assistant:

TEST(AomImageTest, AomImgSetRectOverflow) {
  const int kWidth = 128;
  const int kHeight = 128;
  unsigned char buf[kWidth * kHeight * 3];

  aom_image_t img;
  aom_img_fmt_t format = AOM_IMG_FMT_I444;
  unsigned int align = 32;
  EXPECT_EQ(aom_img_wrap(&img, format, kWidth, kHeight, align, buf), &img);

  EXPECT_EQ(aom_img_set_rect(&img, 0, 0, kWidth, kHeight, 0), 0);
  // This would result in overflow because -1 is cast to UINT_MAX.
  EXPECT_NE(aom_img_set_rect(&img, static_cast<unsigned int>(-1),
                             static_cast<unsigned int>(-1), kWidth, kHeight, 0),
            0);
}